

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O2

void __thiscall
Parser_parseSineImportsModelFromFile_Test::TestBody(Parser_parseSineImportsModelFromFile_Test *this)

{
  char *pcVar1;
  unsigned_long local_70;
  unsigned_long local_68 [4];
  AssertionResult gtest_ar;
  ParserPtr p;
  string local_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  libcellml::Parser::create(SUB81(&p,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"sine_approximations_import.xml",(allocator<char> *)&local_70);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel(local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_68);
  local_68[0] = 0;
  local_70 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","p->issueCount()",local_68,&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/file_parser.cpp"
               ,0x29,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Parser, parseSineImportsModelFromFile)
{
    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(fileContents("sine_approximations_import.xml"));

    EXPECT_EQ(size_t(0), p->issueCount());
}